

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_default_vfs_tell(ma_vfs *pVFS,ma_vfs_file file,ma_int64 *pCursor)

{
  ma_result mVar1;
  long lVar2;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pCursor != (ma_int64 *)0x0) &&
     (*pCursor = 0, mVar1 = MA_INVALID_ARGS, file != (ma_vfs_file)0x0)) {
    lVar2 = ftell((FILE *)file);
    *pCursor = lVar2;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

static ma_result ma_default_vfs_tell(ma_vfs* pVFS, ma_vfs_file file, ma_int64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_tell__win32(pVFS, file, pCursor);
#else
    return ma_default_vfs_tell__stdio(pVFS, file, pCursor);
#endif
}